

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O3

int testFileWriterTestsReadData(void)

{
  string *psVar1;
  ostream *poVar2;
  SpanSize<18446744073709551615UL> in_RCX;
  Span<unsigned_char,_18446744073709551615UL> data;
  Span<unsigned_char,_18446744073709551615UL> destData;
  Span<unsigned_char,_18446744073709551615UL> destData_00;
  Span<unsigned_char,_18446744073709551615UL> destData_01;
  data data1;
  data_p2 out2;
  data_p1 out1;
  AutoDeleteTempFile tempfile;
  FileWriter writer;
  undefined1 local_278 [12];
  char local_26c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  AutoDeleteTempFile local_258;
  FileWriter local_230;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_258);
  local_278[0] = 'b';
  local_278._4_8_ = 0x3e70242d00000017;
  local_26c = 's';
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_258);
  data.m_size.m_size = in_RCX.m_size;
  data.m_ptr = (pointer)0x10;
  MILBlob::TestUtil::WriteBlobFile<unsigned_char,18446744073709551615ul>
            ((TestUtil *)psVar1,(string *)local_278,data);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_258);
  MILBlob::Blob::FileWriter::FileWriter(&local_230,psVar1,false);
  destData.m_size.m_size = 8;
  destData.m_ptr = (pointer)(local_268._M_local_buf + 8);
  MILBlob::Blob::FileWriter::ReadData(&local_230,0,destData);
  destData_00.m_size.m_size = 8;
  destData_00.m_ptr = (pointer)&local_268;
  MILBlob::Blob::FileWriter::ReadData(&local_230,8,destData_00);
  if (local_278[0] == local_268._M_local_buf[8]) {
    if (local_278._4_4_ == local_268._12_4_) {
      if (((float)local_278._8_4_ != (float)local_268._M_allocated_capacity._0_4_) ||
         (NAN((float)local_278._8_4_) || NAN((float)local_268._M_allocated_capacity._0_4_))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xbe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(data1.c) == (out2.c)",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      }
      else {
        if (local_26c == local_268._M_local_buf[4]) {
          destData_01.m_size.m_size = 0x10;
          destData_01.m_ptr = local_278;
          MILBlob::Blob::FileWriter::ReadData(&local_230,8,destData_01);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::clog,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                     ,0x6f);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0xc4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,": expected exception, but none thrown.\n",0x27);
          goto LAB_001c3017;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xbf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(data1.d) == (out2.d)",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xbd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(data1.b) == (out1.b)",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xbc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(data1.a) == (out1.a)",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  std::ostream::put((char)poVar2);
  std::ostream::flush();
LAB_001c3017:
  MILBlob::Blob::FileWriter::~FileWriter(&local_230);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_258);
  return 1;
}

Assistant:

int testFileWriterTestsReadData()
{
    AutoDeleteTempFile tempfile;
    // Reading Data from file via Writer
    {
        struct data {
            char a;
            int b;
            float c;
            char d;
        };

        struct data_p1 {
            char a;
            int b;
        };

        struct data_p2 {
            float c;
            char d;
        };

        data data1;
        data1.a = 'b';
        data1.b = 23;
        data1.c = 0.234513f;
        data1.d = 's';

        data_p1 out1;
        data_p2 out2;

        uint64_t offset1 = 0;
        uint64_t offset2 = sizeof(out1);
        {
            TestUtil::WriteBlobFile(tempfile.GetFilename(), CastAndMakeSpan(data1));
        }

        FileWriter writer(tempfile.GetFilename(), /* truncateFile */ false);

        writer.ReadData(offset1, CastAndMakeSpan(out1));
        writer.ReadData(offset2, CastAndMakeSpan(out2));

        // Validate data
        ML_ASSERT_EQ(data1.a, out1.a);
        ML_ASSERT_EQ(data1.b, out1.b);
        ML_ASSERT_EQ(data1.c, out2.c);
        ML_ASSERT_EQ(data1.d, out2.d);

        // Unable to read data i.e. reached end of file
        ML_ASSERT_THROWS_WITH_MESSAGE(writer.ReadData(offset2, CastAndMakeSpan(data1)),
                                      std::runtime_error,
                                      "Unknown error occurred while reading data from the file.");
    }

    return 0;
}